

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryBuilder::readGlobals(WasmBinaryBuilder *this)

{
  IString *this_00;
  char cVar1;
  bool bVar2;
  uint32_t uVar3;
  ostream *poVar4;
  Type TVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  char cVar9;
  ulong __val;
  string_view sVar10;
  string local_b8;
  Expression *local_98;
  Module *local_90;
  WasmBinaryBuilder *local_88;
  ulong local_80;
  size_type *local_78;
  string __str;
  long local_48;
  long lStack_40;
  _Head_base<0UL,_wasm::Global_*,_false> local_38;
  __single_object glob;
  
  bVar2 = isDebugEnabled("binary");
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"== readGlobals\n",0xf)
    ;
  }
  uVar3 = getU32LEB(this);
  bVar2 = isDebugEnabled("binary");
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"num: ",5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if ((ulong)uVar3 != 0) {
    __val = 0;
    local_88 = this;
    local_80 = (ulong)uVar3;
    do {
      bVar2 = isDebugEnabled("binary");
      if (bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"read one\n",9);
      }
      TVar5 = getConcreteType(this);
      uVar3 = getU32LEB(this);
      if (1 < uVar3) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Global mutability must be 0 or 1","");
        throwError(this,&local_b8);
      }
      local_98 = readExpression(this);
      cVar9 = '\x01';
      if (9 < __val) {
        uVar7 = __val;
        cVar1 = '\x04';
        do {
          cVar9 = cVar1;
          if (uVar7 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_00973546;
          }
          if (uVar7 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_00973546;
          }
          if (uVar7 < 10000) goto LAB_00973546;
          bVar2 = 99999 < uVar7;
          uVar7 = uVar7 / 10000;
          cVar1 = cVar9 + '\x04';
        } while (bVar2);
        cVar9 = cVar9 + '\x01';
      }
LAB_00973546:
      local_90 = this->wasm;
      local_78 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_78,cVar9);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_78,(uint)__str._M_dataplus._M_p,__val);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0xbb93f9);
      __str.field_2._8_8_ = &local_48;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_48 = *plVar8;
        lStack_40 = plVar6[3];
      }
      else {
        local_48 = *plVar8;
        __str.field_2._8_8_ = (long *)*plVar6;
      }
      this_00 = (IString *)plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      sVar10._M_str = (char *)0x0;
      sVar10._M_len = __str.field_2._8_8_;
      sVar10 = IString::interned(this_00,sVar10,SUB81(plVar8,0));
      local_38._M_head_impl = (Global *)operator_new(0x50);
      (local_38._M_head_impl)->init = (Expression *)0x0;
      *(undefined8 *)&(local_38._M_head_impl)->mutable_ = 0;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->type).id = 0;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
      *(undefined8 *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
           (char *)0x0;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar10;
      ((local_38._M_head_impl)->type).id = TVar5.id;
      (local_38._M_head_impl)->init = local_98;
      (local_38._M_head_impl)->mutable_ = uVar3 == 1;
      Module::addGlobal(local_90,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                                 &local_38);
      uVar7 = local_80;
      this = local_88;
      if (local_38._M_head_impl != (Global *)0x0) {
        operator_delete(local_38._M_head_impl,0x50);
      }
      local_38._M_head_impl = (Global *)0x0;
      if ((long *)__str.field_2._8_8_ != &local_48) {
        operator_delete((void *)__str.field_2._8_8_,local_48 + 1);
      }
      if (local_78 != &__str._M_string_length) {
        operator_delete(local_78,__str._M_string_length + 1);
      }
      __val = __val + 1;
    } while (__val != uVar7);
  }
  return;
}

Assistant:

void WasmBinaryBuilder::readGlobals() {
  BYN_TRACE("== readGlobals\n");
  size_t num = getU32LEB();
  BYN_TRACE("num: " << num << std::endl);
  for (size_t i = 0; i < num; i++) {
    BYN_TRACE("read one\n");
    auto type = getConcreteType();
    auto mutable_ = getU32LEB();
    if (mutable_ & ~1) {
      throwError("Global mutability must be 0 or 1");
    }
    auto* init = readExpression();
    wasm.addGlobal(
      Builder::makeGlobal("global$" + std::to_string(i),
                          type,
                          init,
                          mutable_ ? Builder::Mutable : Builder::Immutable));
  }
}